

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniOutputVector_Test::TestBody(TApp_IniOutputVector_Test *this)

{
  App *this_00;
  char *message;
  long lVar1;
  allocator local_139;
  AssertHelper local_138;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> v;
  string local_100;
  string local_e0;
  string local_c0;
  string str;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_c0,"--vector",(allocator *)&str);
  std::__cxx11::string::string((string *)&local_e0,"",(allocator *)&gtest_ar);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_option<int>(this_00,&local_c0,&v,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&str,"--vector",(allocator *)&gtest_ar);
  std::__cxx11::string::string(local_80,"1",(allocator *)&local_130);
  std::__cxx11::string::string(local_60,"2",(allocator *)&local_138);
  std::__cxx11::string::string(local_40,"3",&local_139);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&str,&stack0xffffffffffffffe0);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string(local_80 + lVar1 + -0x20);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  message = "";
  std::__cxx11::string::string((string *)&local_100,"",(allocator *)&gtest_ar);
  CLI::App::config_to_str(&str,this_00,false,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"vector=1 2 3\\n\"","str",(char (*) [14])"vector=1 2 3\n",&str)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x24c,message);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_130);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST_F(TApp, IniOutputVector) {

    std::vector<int> v;
    app.add_option("--vector", v);

    args = {"--vector", "1", "2", "3"};

    run();

    std::string str = app.config_to_str();
    EXPECT_EQ("vector=1 2 3\n", str);
}